

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

_Bool fy_node_mapping_contains_pair(fy_node *fyn_map,fy_node_pair *fynp)

{
  fy_node_pair *pfVar1;
  fy_token *pfVar2;
  
  if ((fynp != (fy_node_pair *)0x0 && fyn_map != (fy_node *)0x0) && ((fyn_map->field_0x34 & 3) == 2)
     ) {
    if (fyn_map->xl == (fy_accel *)0x0) {
      pfVar2 = (fyn_map->field_12).scalar;
      if (pfVar2 != (fy_token *)0x0 && pfVar2 != (fy_token *)&fyn_map->field_12) {
        do {
          if (pfVar2 == (fy_token *)fynp) {
            return true;
          }
          pfVar2 = (fy_token *)(pfVar2->node).next;
          if (pfVar2 == (fy_token *)&fyn_map->field_12) {
            pfVar2 = (fy_token *)0x0;
          }
        } while (pfVar2 != (fy_token *)0x0);
      }
    }
    else {
      pfVar1 = (fy_node_pair *)fy_accel_lookup(fyn_map->xl,fynp->key);
      if (pfVar1 == fynp) {
        return true;
      }
    }
    return false;
  }
  return false;
}

Assistant:

bool fy_node_mapping_contains_pair(struct fy_node *fyn_map, struct fy_node_pair *fynp) {
    struct fy_node_pair *fynpi;

    if (!fyn_map || !fynp || fyn_map->type != FYNT_MAPPING)
        return false;

    if (fyn_map->xl) {
        fynpi = fy_node_accel_lookup_by_node(fyn_map, fynp->key);
        if (fynpi == fynp)
            return true;
    } else {
        for (fynpi = fy_node_pair_list_head(&fyn_map->mapping); fynpi; fynpi = fy_node_pair_next(&fyn_map->mapping,
                                                                                                 fynpi))
            if (fynpi == fynp)
                return true;
    }

    return false;
}